

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O3

void despot::util::tinyxml::TiXmlBase::ConvertUTF32ToUTF8
               (unsigned_long input,char *output,int *length)

{
  long lVar1;
  unsigned_long FIRST_BYTE_MARK [7];
  
  FIRST_BYTE_MARK[0] = 0;
  FIRST_BYTE_MARK[1] = 0;
  FIRST_BYTE_MARK[2] = 0xc0;
  FIRST_BYTE_MARK[3] = 0xe0;
  FIRST_BYTE_MARK[4] = 0xf0;
  FIRST_BYTE_MARK[5] = 0xf8;
  FIRST_BYTE_MARK[6] = 0xfc;
  if (input < 0x80) {
    *length = 1;
    lVar1 = 1;
  }
  else {
    if (input < 0x800) {
      *length = 2;
    }
    else {
      if (input < 0x10000) {
        *length = 3;
      }
      else {
        if (0x1fffff < input) {
          *length = 0;
          return;
        }
        *length = 4;
        output[3] = (byte)input & 0x3f | 0x80;
        input = input >> 6;
      }
      output[2] = (byte)input & 0x3f | 0x80;
      input = input >> 6;
    }
    output[1] = (byte)input & 0x3f | 0x80;
    input = input >> 6;
    lVar1 = (long)*length;
  }
  *output = (byte)input | (byte)(int)FIRST_BYTE_MARK[lVar1];
  return;
}

Assistant:

void TiXmlBase::ConvertUTF32ToUTF8(unsigned long input, char* output,
	int* length) {
	const unsigned long BYTE_MASK = 0xBF;
	const unsigned long BYTE_MARK = 0x80;
	const unsigned long FIRST_BYTE_MARK[7] = { 0x00, 0x00, 0xC0, 0xE0, 0xF0,
		0xF8, 0xFC };

	if (input < 0x80)
		*length = 1;
	else if (input < 0x800)
		*length = 2;
	else if (input < 0x10000)
		*length = 3;
	else if (input < 0x200000)
		*length = 4;
	else {
		*length = 0;
		return;
	} // This code won't covert this correctly anyway.

	output += *length;

	// Scary scary fall throughs.
	switch (*length) {
	case 4:
		--output;
		*output = (char) ((input | BYTE_MARK) & BYTE_MASK);
		input >>= 6;
	case 3:
		--output;
		*output = (char) ((input | BYTE_MARK) & BYTE_MASK);
		input >>= 6;
	case 2:
		--output;
		*output = (char) ((input | BYTE_MARK) & BYTE_MASK);
		input >>= 6;
	case 1:
		--output;
		*output = (char) (input | FIRST_BYTE_MARK[*length]);
	}
}